

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

bool isPartOfList(Identifier *value,initializer_list<const_char_*> *terminators)

{
  initializer_list<const_char_*> *this;
  bool bVar1;
  string_view local_50;
  char *local_40;
  char *term;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<const_char_*> *__range1;
  initializer_list<const_char_*> *terminators_local;
  Identifier *value_local;
  
  __begin1 = (const_iterator)terminators;
  __range1 = terminators;
  terminators_local = (initializer_list<const_char_*> *)value;
  __end1 = std::initializer_list<const_char_*>::begin(terminators);
  term = (char *)std::initializer_list<const_char_*>::end
                           ((initializer_list<const_char_*> *)__begin1);
  while( true ) {
    this = terminators_local;
    if (__end1 == (const_iterator)term) {
      return false;
    }
    local_40 = *__end1;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50,local_40);
    bVar1 = Identifier::operator==((Identifier *)this,local_50);
    if (bVar1) break;
    __end1 = __end1 + 1;
  }
  return true;
}

Assistant:

inline bool isPartOfList(const Identifier& value, const std::initializer_list<const char*>& terminators)
{
	for (const char* term: terminators)
	{
		if (value == term)
			return true;
	}

	return false;
}